

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O3

void duckdb_je_edata_heap_insert(edata_heap_t *ph,edata_t *phn)

{
  edata_t *peVar1;
  ulong uVar2;
  edata_t *peVar3;
  edata_t *peVar4;
  edata_t *peVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  
  (phn->field_5).ql_link_active.qre_next = (edata_t *)0x0;
  (phn->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
  *(undefined8 *)((long)&phn->field_5 + 0x10) = 0;
  peVar1 = (edata_t *)(ph->ph).root;
  if (peVar1 == (edata_t *)0x0) {
    (ph->ph).root = phn;
    return;
  }
  uVar7 = phn->e_sn;
  uVar2 = peVar1->e_sn;
  if ((int)(((uint)(uVar7 >= uVar2 && uVar7 != uVar2) - (uint)(uVar7 < uVar2)) * 2 -
           (uint)(phn->e_addr < peVar1->e_addr)) < 0) {
    *(edata_t **)((long)&phn->field_5 + 0x10) = peVar1;
    (peVar1->field_5).ql_link_active.qre_next = phn;
    (ph->ph).root = phn;
    (ph->ph).auxcount = 0;
    return;
  }
  peVar3 = (peVar1->field_5).ql_link_active.qre_prev;
  (phn->field_5).ql_link_active.qre_prev = peVar3;
  if (peVar3 != (edata_t *)0x0) {
    (peVar3->field_5).ql_link_active.qre_next = phn;
  }
  (phn->field_5).ql_link_active.qre_next = peVar1;
  (peVar1->field_5).ql_link_active.qre_prev = phn;
  uVar7 = (ph->ph).auxcount + 1;
  (ph->ph).auxcount = uVar7;
  lVar6 = 0;
  if (uVar7 != 0) {
    for (; (uVar7 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  if (lVar6 != 0) {
    uVar8 = 1;
    while (peVar3 = (phn->field_5).ql_link_active.qre_prev, peVar3 != (edata_t *)0x0) {
      peVar4 = (peVar3->field_5).ql_link_active.qre_prev;
      (phn->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      (phn->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
      (peVar3->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      (peVar3->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
      uVar7 = phn->e_sn;
      uVar2 = peVar3->e_sn;
      if ((int)(((uint)(uVar7 >= uVar2 && uVar7 != uVar2) - (uint)(uVar7 < uVar2)) * 2 -
               (uint)(phn->e_addr < peVar3->e_addr)) < 0) {
        (peVar3->field_5).ql_link_active.qre_next = phn;
        peVar5 = *(edata_t **)((long)&phn->field_5 + 0x10);
        (peVar3->field_5).ql_link_active.qre_prev = peVar5;
        if (peVar5 != (edata_t *)0x0) {
          (peVar5->field_5).ql_link_active.qre_next = peVar3;
        }
        *(edata_t **)((long)&phn->field_5 + 0x10) = peVar3;
      }
      else {
        (phn->field_5).ql_link_active.qre_next = peVar3;
        peVar5 = *(edata_t **)((long)&peVar3->field_5 + 0x10);
        (phn->field_5).ql_link_active.qre_prev = peVar5;
        if (peVar5 != (edata_t *)0x0) {
          (peVar5->field_5).ql_link_active.qre_next = phn;
        }
        *(edata_t **)((long)&peVar3->field_5 + 0x10) = phn;
        phn = peVar3;
      }
      (phn->field_5).ql_link_active.qre_prev = peVar4;
      if (peVar4 == (edata_t *)0x0) {
        (peVar1->field_5).ql_link_active.qre_prev = phn;
        (phn->field_5).ql_link_active.qre_next = peVar1;
        return;
      }
      (peVar4->field_5).ql_link_active.qre_next = phn;
      (peVar1->field_5).ql_link_active.qre_prev = phn;
      (phn->field_5).ql_link_active.qre_next = peVar1;
      if (peVar4 == (edata_t *)0x0) {
        return;
      }
      bVar9 = (uint)lVar6 <= uVar8;
      uVar8 = uVar8 + 1;
      if (bVar9) {
        return;
      }
    }
  }
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void
phn_link_init(void *phn, size_t offset) {
	phn_link_get(phn, offset)->prev = NULL;
	phn_link_get(phn, offset)->next = NULL;
	phn_link_get(phn, offset)->lchild = NULL;
}